

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_CallConstructorInternal
                  (JSContext *ctx,JSValue func_obj,JSValue new_target,int argc,JSValue *argv,
                  int flags)

{
  JSClassCall *pJVar1;
  int iVar2;
  JSValueUnion JVar3;
  ulong uVar4;
  uint flags_00;
  JSValueUnion JVar5;
  char *fmt;
  JSValue this_obj;
  JSValue JVar6;
  JSValue JVar7;
  JSValue new_target_local;
  
  JVar5 = func_obj.u;
  iVar2 = js_poll_interrupts(ctx);
  if (iVar2 == 0) {
    if ((int)func_obj.tag == -1) {
      if ((*(byte *)((long)JVar5.ptr + 5) & 0x10) != 0) {
        flags_00 = flags | 1;
        if ((ulong)*(ushort *)((long)JVar5.ptr + 6) == 0xd) {
          if ((*(byte *)(*(long *)((long)JVar5.ptr + 0x30) + 0x19) & 4) != 0) {
            JVar6 = JS_CallInternal(ctx,func_obj,(JSValue)(ZEXT816(3) << 0x40),new_target,argc,argv,
                                    flags_00);
            goto LAB_00123b18;
          }
          this_obj = js_create_from_ctor(ctx,new_target,1);
          if ((int)this_obj.tag == 6) {
            uVar4 = 0;
            this_obj = (JSValue)(ZEXT816(6) << 0x40);
            goto LAB_00123b8b;
          }
          JVar6 = JS_CallInternal(ctx,func_obj,this_obj,new_target,argc,argv,flags_00);
          JVar3 = JVar6.u;
          if (((int)JVar6.tag != 6) && ((int)JVar6.tag != -1)) {
            JS_FreeValue(ctx,JVar6);
            uVar4 = (ulong)this_obj.u.ptr & 0xffffffff00000000;
            goto LAB_00123b8b;
          }
          JS_FreeValue(ctx,this_obj);
          JVar6.tag = JVar6.tag;
          JVar6.u.float64 = -NAN;
          JVar5 = JVar3;
        }
        else {
          pJVar1 = ctx->rt->class_array[*(ushort *)((long)JVar5.ptr + 6)].call;
          if (pJVar1 == (JSClassCall *)0x0) goto LAB_00123c05;
          JVar6 = (*pJVar1)(ctx,func_obj,new_target,argc,argv,flags_00);
LAB_00123b18:
          JVar5 = JVar6.u;
          JVar3.float64 = -NAN;
        }
        this_obj.tag = JVar6.tag;
        this_obj.u.ptr = JVar5.ptr;
        uVar4 = (ulong)JVar3.ptr & (ulong)JVar6.u.ptr;
        goto LAB_00123b8b;
      }
      fmt = "not a constructor";
    }
    else {
LAB_00123c05:
      fmt = "not a function";
    }
    JS_ThrowTypeError(ctx,fmt);
  }
  this_obj = (JSValue)(ZEXT816(6) << 0x40);
  uVar4 = 0;
LAB_00123b8b:
  JVar7.tag = this_obj.tag;
  JVar7.u.ptr = (void *)((ulong)this_obj.u.ptr & 0xffffffff | uVar4);
  return JVar7;
}

Assistant:

static JSValue JS_CallConstructorInternal(JSContext *ctx,
                                          JSValueConst func_obj,
                                          JSValueConst new_target,
                                          int argc, JSValue *argv, int flags)
{
    JSObject *p;
    JSFunctionBytecode *b;

    if (js_poll_interrupts(ctx))
        return JS_EXCEPTION;
    flags |= JS_CALL_FLAG_CONSTRUCTOR;
    if (unlikely(JS_VALUE_GET_TAG(func_obj) != JS_TAG_OBJECT))
        goto not_a_function;
    p = JS_VALUE_GET_OBJ(func_obj);
    if (unlikely(!p->is_constructor))
        return JS_ThrowTypeError(ctx, "not a constructor");
    if (unlikely(p->class_id != JS_CLASS_BYTECODE_FUNCTION)) {
        JSClassCall *call_func;
        call_func = ctx->rt->class_array[p->class_id].call;
        if (!call_func) {
        not_a_function:
            return JS_ThrowTypeError(ctx, "not a function");
        }
        return call_func(ctx, func_obj, new_target, argc,
                         (JSValueConst *)argv, flags);
    }

    b = p->u.func.function_bytecode;
    if (b->is_derived_class_constructor) {
        return JS_CallInternal(ctx, func_obj, JS_UNDEFINED, new_target, argc, argv, flags);
    } else {
        JSValue obj, ret;
        /* legacy constructor behavior */
        obj = js_create_from_ctor(ctx, new_target, JS_CLASS_OBJECT);
        if (JS_IsException(obj))
            return JS_EXCEPTION;
        ret = JS_CallInternal(ctx, func_obj, obj, new_target, argc, argv, flags);
        if (JS_VALUE_GET_TAG(ret) == JS_TAG_OBJECT ||
            JS_IsException(ret)) {
            JS_FreeValue(ctx, obj);
            return ret;
        } else {
            JS_FreeValue(ctx, ret);
            return obj;
        }
    }
}